

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SimdInt8x16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  long lVar1;
  long lVar2;
  SIMDValue SVar3;
  int8 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  int8 values [16];
  
  lVar1 = *(long *)(this + 0x118);
  local_28 = *(int8 *)(lVar1 + (ulong)playout->I1 * 4);
  local_27 = *(undefined1 *)(lVar1 + (ulong)playout->I2 * 4);
  local_26 = *(undefined1 *)(lVar1 + (ulong)playout->I3 * 4);
  local_25 = *(undefined1 *)(lVar1 + (ulong)playout->I4 * 4);
  local_24 = *(undefined1 *)(lVar1 + (ulong)playout->I5 * 4);
  local_23 = *(undefined1 *)(lVar1 + (ulong)playout->I6 * 4);
  local_22 = *(undefined1 *)(lVar1 + (ulong)playout->I7 * 4);
  local_21 = *(undefined1 *)(lVar1 + (ulong)playout->I8 * 4);
  values[0] = *(int8 *)(lVar1 + (ulong)playout->I9 * 4);
  values[1] = *(int8 *)(lVar1 + (ulong)playout->I10 * 4);
  values[2] = *(int8 *)(lVar1 + (ulong)playout->I11 * 4);
  values[3] = *(int8 *)(lVar1 + (ulong)playout->I12 * 4);
  values[4] = *(int8 *)(lVar1 + (ulong)playout->I13 * 4);
  values[5] = *(int8 *)(lVar1 + (ulong)playout->I14 * 4);
  values[6] = *(int8 *)(lVar1 + (ulong)playout->I15 * 4);
  values[7] = *(int8 *)(lVar1 + (ulong)playout->I16 * 4);
  SVar3 = SIMDInt8x16Operation::OpInt8x16(&local_28);
  lVar1 = *(long *)(this + 0x148);
  lVar2 = (ulong)playout->I16_0 * 0x10;
  *(long *)(lVar1 + lVar2) = SVar3.field_0._0_8_;
  *(long *)(lVar1 + 8 + lVar2) = SVar3.field_0._8_8_;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdInt8x16(const unaligned T* playout)
    {
        int8 values[16];
        values[0] = (int8)GetRegRawInt(playout->I1);
        values[1] = (int8)GetRegRawInt(playout->I2);
        values[2] = (int8)GetRegRawInt(playout->I3);
        values[3] = (int8)GetRegRawInt(playout->I4);
        values[4] = (int8)GetRegRawInt(playout->I5);
        values[5] = (int8)GetRegRawInt(playout->I6);
        values[6] = (int8)GetRegRawInt(playout->I7);
        values[7] = (int8)GetRegRawInt(playout->I8);
        values[8] = (int8)GetRegRawInt(playout->I9);
        values[9] = (int8)GetRegRawInt(playout->I10);
        values[10] = (int8)GetRegRawInt(playout->I11);
        values[11] = (int8)GetRegRawInt(playout->I12);
        values[12] = (int8)GetRegRawInt(playout->I13);
        values[13] = (int8)GetRegRawInt(playout->I14);
        values[14] = (int8)GetRegRawInt(playout->I15);
        values[15] = (int8)GetRegRawInt(playout->I16);

        AsmJsSIMDValue result = SIMDInt8x16Operation::OpInt8x16(values);
        SetRegRawSimd(playout->I16_0, result);
    }